

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
emplace_value<int>(btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                   *this,size_type i,allocator_type *alloc,int *args)

{
  int *piVar1;
  allocator_type *paVar2;
  byte bVar3;
  byte bVar4;
  field_type fVar5;
  bool bVar6;
  slot_type *src;
  slot_type *dest;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *c;
  uint local_3c;
  long lStack_38;
  int j_1;
  size_type j;
  int *local_28;
  int *args_local;
  allocator_type *alloc_local;
  size_type i_local;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *this_local;
  
  local_28 = args;
  args_local = (int *)alloc;
  alloc_local = (allocator_type *)i;
  i_local = (size_type)this;
  bVar3 = count(this);
  paVar2 = alloc_local;
  if (i <= (long)(ulong)bVar3) {
    bVar3 = count(this);
    if ((long)paVar2 < (long)(ulong)bVar3) {
      bVar3 = count(this);
      piVar1 = args_local;
      bVar4 = count(this);
      j = (size_type)slot(this,bVar4 - 1);
      btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
      ::
      value_init<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>::slot_type*>
                ((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                  *)this,(ulong)bVar3,(allocator_type *)piVar1,(slot_type **)&j);
      bVar3 = count(this);
      for (lStack_38 = (long)(int)(bVar3 - 1); piVar1 = args_local, (long)alloc_local < lStack_38;
          lStack_38 = lStack_38 + -1) {
        src = slot(this,(int)lStack_38 + -1);
        dest = slot(this,(int)lStack_38);
        set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>::slot_type::move
                  ((allocator<int> *)piVar1,src,dest);
      }
      value_destroy(this,(size_type)alloc_local,(allocator_type *)args_local);
    }
    value_init<int>(this,(size_type)alloc_local,(allocator_type *)args_local,local_28);
    fVar5 = count(this);
    set_count(this,fVar5 + '\x01');
    bVar6 = leaf(this);
    if (!bVar6) {
      bVar3 = count(this);
      if ((long)(alloc_local + 1) < (long)(ulong)bVar3) {
        bVar3 = count(this);
        for (local_3c = (uint)bVar3; (long)(alloc_local + 1) < (long)(int)local_3c;
            local_3c = local_3c - 1) {
          c = child(this,local_3c - 1);
          set_child(this,local_3c,c);
        }
        clear_child(this,(int)alloc_local + 1);
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x5d5,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>, Args = <int>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                         allocator_type *alloc,
                                         Args &&... args) {
  assert(i <= count());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < count()) {
    value_init(count(), alloc, slot(count() - 1));
    for (size_type j = count() - 1; j > i; --j)
      slot_type::move(alloc, slot(j - 1), slot(j));
    value_destroy(i, alloc);
  }
  value_init(i, alloc, std::forward<Args>(args)...);
  set_count(count() + 1);

  if (!leaf() && count() > i + 1) {
    for (int j = count(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}